

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderLibraryTest::~ShaderLibraryTest(ShaderLibraryTest *this)

{
  ~ShaderLibraryTest(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

ShaderLibraryTest (Context& context, const char* filename, const char* name, const char* description)
		: TestCaseGroup	(context, name, description)
		, m_filename	(filename)
	{
	}